

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O2

void indk::System::setComputeBackend(int Backend,int Parameter)

{
  int iVar1;
  ComputeBackendDefault *this;
  ComputeBackendMultithread *this_00;
  ostream *poVar2;
  
  if (CurrentComputeBackend != -1) {
    operator_delete(ComputeBackend,8);
  }
  CurrentComputeBackend = Backend;
  if (Backend == 2) {
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "The OpenCL compute backend is not supported by the current build. Rebuild interfernce library with the INDK_OPENCL_SUPPORT=ON flag."
                            );
    std::endl<char,std::char_traits<char>>(poVar2);
    CurrentComputeBackend = -1;
    iVar1 = ComputeBackendParameter;
  }
  else if (Backend == 1) {
    SynchronizationNeeded = true;
    this_00 = (ComputeBackendMultithread *)operator_new(0x58);
    iVar1 = 2;
    if (2 < Parameter) {
      iVar1 = Parameter;
    }
    ComputeBackendMultithread::ComputeBackendMultithread(this_00,iVar1);
    iVar1 = Parameter;
    ComputeBackend = (Computer *)this_00;
  }
  else {
    iVar1 = Parameter;
    if (Backend == 0) {
      SynchronizationNeeded = false;
      this = (ComputeBackendDefault *)operator_new(0x20);
      ComputeBackendDefault::ComputeBackendDefault(this);
      iVar1 = 1;
      ComputeBackend = (Computer *)this;
    }
  }
  ComputeBackendParameter = iVar1;
  return;
}

Assistant:

void indk::System::setComputeBackend(int Backend, int Parameter) {
    if (CurrentComputeBackend != -1) delete ComputeBackend;
    CurrentComputeBackend = Backend;

    switch (CurrentComputeBackend) {
        case indk::System::ComputeBackends::Default:
            SynchronizationNeeded = false;
            ComputeBackend = new indk::ComputeBackendDefault();
            Parameter = 1;
            break;
        case indk::System::ComputeBackends::Multithread:
            SynchronizationNeeded = true;
            ComputeBackend = new indk::ComputeBackendMultithread(Parameter>1?Parameter:indk_MULTITHREAD_DEFAULT_NUM);
            break;
        case indk::System::ComputeBackends::OpenCL:
#ifdef INDK_OPENCL_SUPPORT
            SynchronizationNeeded = true;
            ComputeBackend = new indk::ComputeBackendOpenCL();
            Parameter = 1;
            break;
#else
            std::cerr << std::endl;
            std::cerr << "The OpenCL compute backend is not supported by the current build. Rebuild interfernce library with the INDK_OPENCL_SUPPORT=ON flag." << std::endl;
            CurrentComputeBackend = -1;
            return;
#endif
    }
    ComputeBackendParameter = Parameter;
}